

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::PrintBelief(BaseTag *this)

{
  return;
}

Assistant:

void BaseTag::PrintAction(ACT_TYPE action, ostream& out) const {
	switch(action) {
		case 0: out << "North" << endl; break;
		case 1: out << "East" << endl; break;
		case 2: out << "South" << endl; break;
		case 3: out << "West" << endl; break;
		case 4: out << "Tag" << endl; break;
		default: out << "Wrong action" << endl; exit(1);
	}
}